

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrNtbdd.c
# Opt level: O2

int Aig_ManSizeOfGlobalBdds(Aig_Man_t *p)

{
  DdNode *pDVar1;
  int iVar2;
  DdNode **nodeArray;
  void *pvVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  
  iVar2 = 8;
  if (6 < p->nObjs[3] - 1U) {
    iVar2 = p->nObjs[3];
  }
  if (iVar2 == 0) {
    nodeArray = (DdNode **)0x0;
  }
  else {
    nodeArray = (DdNode **)malloc((long)iVar2 << 3);
  }
  lVar6 = 0;
  while( true ) {
    iVar4 = (int)lVar6;
    if (p->vCos->nSize <= iVar4) break;
    pvVar3 = Vec_PtrEntry(p->vCos,iVar4);
    pDVar1 = *(DdNode **)((long)pvVar3 + 0x28);
    if (iVar4 == iVar2) {
      uVar5 = (ulong)(uint)(iVar2 * 2);
      if (iVar2 < 0x10) {
        uVar5 = 0x10;
      }
      iVar4 = (int)uVar5;
      if (iVar2 < iVar4) {
        iVar2 = iVar4;
        if (nodeArray == (DdNode **)0x0) {
          nodeArray = (DdNode **)malloc(uVar5 << 3);
        }
        else {
          nodeArray = (DdNode **)realloc(nodeArray,uVar5 << 3);
        }
      }
    }
    nodeArray[lVar6] = pDVar1;
    lVar6 = lVar6 + 1;
  }
  iVar2 = Cudd_SharingSize(nodeArray,iVar4);
  free(nodeArray);
  return iVar2;
}

Assistant:

int Aig_ManSizeOfGlobalBdds( Aig_Man_t * p ) 
{
    Vec_Ptr_t * vFuncsGlob;
    Aig_Obj_t * pObj;
    int RetValue, i;
    // complement the global functions
    vFuncsGlob = Vec_PtrAlloc( Aig_ManCoNum(p) );
    Aig_ManForEachCo( p, pObj, i )
        Vec_PtrPush( vFuncsGlob, Aig_ObjGlobalBdd(pObj) );
    RetValue = Cudd_SharingSize( (DdNode **)Vec_PtrArray(vFuncsGlob), Vec_PtrSize(vFuncsGlob) );
    Vec_PtrFree( vFuncsGlob );
    return RetValue;
}